

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctl.c
# Opt level: O0

int arena_i_decay_ctl(tsd_t *tsd,size_t *mib,size_t miblen,void *oldp,size_t *oldlenp,void *newp,
                     size_t newlen)

{
  long in_RCX;
  long in_RSI;
  tsdn_t *in_RDI;
  long in_R8;
  long in_R9;
  uint arena_ind;
  int ret;
  undefined4 local_3c;
  
  if ((in_R9 == 0) && (_arena_ind == 0)) {
    if ((in_RCX == 0) && (in_R8 == 0)) {
      if (*(ulong *)(in_RSI + 8) < 0x100000000) {
        arena_i_decay(in_RDI,(uint)*(undefined8 *)(in_RSI + 8),false);
        local_3c = 0;
      }
      else {
        local_3c = 0xe;
      }
    }
    else {
      local_3c = 1;
    }
  }
  else {
    local_3c = 1;
  }
  return local_3c;
}

Assistant:

static int
arena_i_decay_ctl(tsd_t *tsd, const size_t *mib, size_t miblen, void *oldp,
    size_t *oldlenp, void *newp, size_t newlen) {
	int ret;
	unsigned arena_ind;

	READONLY();
	WRITEONLY();
	MIB_UNSIGNED(arena_ind, 1);
	arena_i_decay(tsd_tsdn(tsd), arena_ind, false);

	ret = 0;
label_return:
	return ret;
}